

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

char * __thiscall CVmObjDate::cast_to_string(CVmObjDate *this,vm_obj_id_t self,vm_val_t *newstr)

{
  vm_obj_id_t obj;
  char *pcVar1;
  vm_val_t *in_RDX;
  char buf [64];
  vm_val_t *this_00;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb4;
  
  format_string_buf((CVmObjDate *)buf._32_8_,(char *)buf._24_8_,buf._16_8_);
  this_00 = (vm_val_t *)&stack0xffffffffffffffa8;
  strlen(&stack0xffffffffffffffa8);
  obj = CVmObjString::create(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,(size_t)in_RDX);
  vm_val_t::set_obj(in_RDX,obj);
  pcVar1 = vm_val_t::get_as_string(this_00);
  return pcVar1;
}

Assistant:

const char *CVmObjDate::cast_to_string(
    VMG_ vm_obj_id_t self, vm_val_t *newstr) const
{
    /* format the date into a buffer */
    char buf[64];
    format_string_buf(vmg_ buf, sizeof(buf));

    /* create the return string */
    newstr->set_obj(CVmObjString::create(vmg_ FALSE, buf, strlen(buf)));
    return newstr->get_as_string(vmg0_);
}